

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool __thiscall nivalis::ParseSession::_mk_tok_link(ParseSession *this)

{
  _Vector_impl_data *p_Var1;
  size_type sVar2;
  pointer plVar3;
  pointer plVar4;
  string *psVar5;
  long lVar6;
  bool bVar7;
  ostream *poVar8;
  pointer *pplVar9;
  long lVar10;
  char cVar11;
  long lVar12;
  vector<long,_std::allocator<long>_> *this_00;
  long local_250;
  int local_244;
  long local_240;
  size_type local_238;
  long local_230;
  string local_228 [32];
  vector<long,_std::allocator<long>_> starts [3];
  stringstream error_msg_stream;
  ostream local_1a8 [376];
  
  starts[2].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  starts[2].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  starts[1].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  starts[1].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  starts[2].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  starts[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  starts[1].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  starts[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  starts[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_250 = 0;
  lVar12 = -1;
  while( true ) {
    sVar2 = this->expr->_M_string_length;
    if ((long)sVar2 <= local_250) break;
    cVar11 = (this->expr->_M_dataplus)._M_p[local_250];
    local_238 = sVar2;
    local_230 = local_250;
    bVar7 = util::is_identifier(cVar11);
    if (bVar7) {
      local_240 = lVar12;
      if (lVar12 == -1) {
        local_240 = local_250;
      }
    }
    else {
      local_240 = -1;
      if (lVar12 != -1) {
        plVar3 = (this->tok_link).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        plVar3[lVar12] = local_250 + -1;
        plVar3[local_250 + -1] = lVar12;
        local_240 = -1;
      }
    }
    this_00 = starts;
    local_244 = (int)cVar11;
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      if (cVar11 == "([{"[lVar12]) {
        std::vector<long,_std::allocator<long>_>::push_back(this_00,&local_250);
      }
      else if (cVar11 == ")]}"[lVar12]) {
        plVar3 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_start == plVar3) {
          std::__cxx11::stringstream::stringstream((stringstream *)&error_msg_stream);
          poVar8 = std::operator<<(local_1a8,"Unmatched \'");
          lVar12 = local_240;
          cVar11 = (char)local_244;
          poVar8 = std::operator<<(poVar8,cVar11);
          std::operator<<(poVar8,"\'\n");
          psVar5 = this->error_msg;
          if (psVar5 != (string *)0x0) {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::append((string *)psVar5);
            std::__cxx11::string::~string(local_228);
          }
          if (this->quiet == false) {
            poVar8 = std::operator<<((ostream *)&std::cout,"Unmatched \'");
            poVar8 = std::operator<<(poVar8,cVar11);
            std::operator<<(poVar8,"\'\n");
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&error_msg_stream);
          if (local_230 < (long)local_238) goto LAB_001b11eb;
          goto LAB_001b110e;
        }
        plVar4 = (this->tok_link).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        plVar4[plVar3[-1]] = local_250;
        plVar4[local_250] = plVar3[-1];
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = plVar3 + -1;
      }
      this_00 = this_00 + 1;
    }
    local_250 = local_250 + 1;
    lVar12 = local_240;
  }
LAB_001b110e:
  pplVar9 = &starts[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar6 = -1;
  do {
    lVar10 = lVar6;
    if (lVar10 == 2) {
      bVar7 = true;
      if (lVar12 != -1) {
        psVar5 = this->expr;
        plVar3 = (this->tok_link).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        plVar3[lVar12] = psVar5->_M_string_length - 1;
        plVar3[psVar5->_M_string_length - 1] = lVar12;
      }
      goto LAB_001b1218;
    }
    p_Var1 = (_Vector_impl_data *)(pplVar9 + -1);
    plVar3 = *pplVar9;
    pplVar9 = pplVar9 + 3;
    lVar6 = lVar10 + 1;
  } while (p_Var1->_M_start == plVar3);
  std::__cxx11::stringstream::stringstream((stringstream *)&error_msg_stream);
  poVar8 = std::operator<<(local_1a8,"Unmatched \'");
  cVar11 = "([{"[lVar10 + 1];
  poVar8 = std::operator<<(poVar8,cVar11);
  std::operator<<(poVar8,"\'\n");
  psVar5 = this->error_msg;
  if (psVar5 != (string *)0x0) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)psVar5);
    std::__cxx11::string::~string(local_228);
  }
  if (this->quiet == false) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Unmatched \'");
    poVar8 = std::operator<<(poVar8,cVar11);
    std::operator<<(poVar8,"\'\n");
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&error_msg_stream);
LAB_001b11eb:
  bVar7 = false;
LAB_001b1218:
  lVar12 = 0x30;
  do {
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)
               ((long)&starts[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  return bVar7;
}

Assistant:

bool _mk_tok_link() {
        // Parenthesis matching
        static const char lb[] = "([{", rb[] = ")]}";
        std::vector<int64_t> starts[3];
        int64_t lit_start = -1;
        for (int64_t pos = 0; pos < static_cast<int64_t>(expr.size()); ++pos) {
            const char c = expr[pos];
            if (util::is_identifier(c)) {
                if (lit_start == -1) lit_start = pos;
            } else {
                if (lit_start != -1) {
                    tok_link[lit_start] = pos-1;
                    tok_link[pos-1] = lit_start;
                    lit_start = -1;
                }
            }
            for (int i = 0; i < 3; ++i) {
                if (c == lb[i]) {
                    starts[i].push_back(pos);
                } else if (c == rb[i]) {
                    if (starts[i].empty()) {
                        PARSE_ERR("Unmatched '" << rb[i] << "'\n");
                    }
                    tok_link[starts[i].back()] = pos;
                    tok_link[pos] = starts[i].back();
                    starts[i].pop_back();
                }
            }
        }
        for (int i = 0; i < 3; ++i) {
            if (!starts[i].empty()) {
                PARSE_ERR("Unmatched '" << lb[i] << "'\n");
            }
        }
        if (lit_start != -1) {
            tok_link[lit_start] = static_cast<int64_t>(expr.size()) - 1;
            tok_link[expr.size() - 1] = lit_start;
            lit_start = -1;
        }
        lit_start = -1;
        return true;
    }